

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::deriv
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nderiv)

{
  double dVar1;
  double dVar2;
  long lVar3;
  Index IVar4;
  Scalar *pSVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  ulong local_78;
  size_t k;
  size_t r;
  undefined1 local_58 [8];
  vectype cd;
  size_t Nd;
  size_t N;
  size_t deriv_counter;
  vectype c;
  size_t Nderiv_local;
  ChebyshevExpansion *this_local;
  
  c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = Nderiv;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)&deriv_counter,&this->m_c);
  for (N = 0; N < (ulong)c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows; N = N + 1) {
    IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&deriv_counter);
    Nd = IVar4 - 1;
    cd.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar4 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)local_58,&Nd);
    for (k = 0; k <= (ulong)cd.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows; k = k + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58,k);
      *pSVar5 = 0.0;
      local_78 = k;
      while (local_78 = local_78 + 1, local_78 <= Nd) {
        if ((local_78 - k & 1) == 1) {
          lVar3 = local_78 * 2;
          auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
          auVar7._0_8_ = lVar3;
          auVar7._12_4_ = 0x45300000;
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &deriv_counter,local_78);
          dVar1 = *pSVar5;
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58
                              ,k);
          *pSVar5 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar1 +
                    *pSVar5;
        }
      }
      if (k == 0) {
        pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58,0
                           );
        *pSVar5 = *pSVar5 / 2.0;
      }
      dVar1 = this->m_xmin;
      dVar2 = this->m_xmax;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_58,k);
      *pSVar5 = *pSVar5 / ((dVar2 - dVar1) * 0.5);
    }
    bVar6 = c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 1;
    if (bVar6) {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)&deriv_counter,
                 (Matrix<double,__1,_1,_0,__1,_1> *)local_58);
    }
    else {
      ChebyshevExpansion(__return_storage_ptr__,(vectype *)local_58,this->m_xmin,this->m_xmax);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_58);
    if (!bVar6) goto LAB_0010caf2;
  }
  ChebyshevExpansion(__return_storage_ptr__,(vectype *)&deriv_counter,this->m_xmin,this->m_xmax);
LAB_0010caf2:
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&deriv_counter)
  ;
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::deriv(std::size_t Nderiv) const {
        // See Mason and Handscomb, p. 34, Eq. 2.52
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        vectype c = m_c;
        for (std::size_t deriv_counter = 0; deriv_counter < Nderiv; ++deriv_counter) {
            std::size_t N = c.size() - 1, ///< Order of the expansion
                        Nd = N - 1; ///< Order of the derivative expansion
            vectype cd(N);
            for (std::size_t r = 0; r <= Nd; ++r) {
                cd(r) = 0;
                for (std::size_t k = r + 1; k <= N; ++k) {
                    // Terms where k-r is odd have values, otherwise, they are zero
                    if ((k - r) % 2 == 1) {
                        cd(r) += 2*k*c(k);
                    }
                }
                // The first term with r = 0 is divided by 2 (the single prime in Mason and Handscomb, p. 34, Eq. 2.52)
                if (r == 0) {
                    cd(r) /= 2;
                }
                // Rescale the values if the range is not [-1,1].  Arrives from the derivative of d(xreal)/d(x_{-1,1})
                cd(r) /= (m_xmax-m_xmin)/2.0;
            }
            if (Nderiv == 1) {
                return ChebyshevExpansion(std::move(cd), m_xmin, m_xmax);
            }
            else{
                c = cd;
            }
        }
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }